

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O3

SNamedPath * __thiscall irr::scene::CMeshCache::getMeshName(CMeshCache *this,IMesh *mesh)

{
  IMesh *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if (mesh != (IMesh *)0x0) {
    lVar4 = *(long *)&(this->super_IMeshCache).field_0x8;
    lVar3 = *(long *)&(this->super_IMeshCache).field_0x10;
    if ((int)((ulong)(lVar3 - lVar4) >> 3) * 0x38e38e39 != 0) {
      lVar5 = 0;
      uVar6 = 0;
      do {
        pIVar1 = *(IMesh **)(lVar4 + 0x40 + lVar5);
        if (pIVar1 == mesh) {
LAB_001c7349:
          return (SNamedPath *)(lVar4 + lVar5);
        }
        if (pIVar1 != (IMesh *)0x0) {
          iVar2 = (*pIVar1->_vptr_IMesh[0xd])(pIVar1,0,0xff,0xffffffff,0xffffffff);
          lVar4 = *(long *)&(this->super_IMeshCache).field_0x8;
          if ((IMesh *)CONCAT44(extraout_var,iVar2) == mesh) goto LAB_001c7349;
          lVar3 = *(long *)&(this->super_IMeshCache).field_0x10;
        }
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x48;
      } while (uVar6 < (uint)((int)((ulong)(lVar3 - lVar4) >> 3) * 0x38e38e39));
    }
  }
  return (SNamedPath *)emptyNamedPath;
}

Assistant:

const io::SNamedPath &CMeshCache::getMeshName(const IMesh *const mesh) const
{
	if (!mesh)
		return emptyNamedPath;

	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh))
			return Meshes[i].NamedPath;
	}

	return emptyNamedPath;
}